

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcDerivedProfileDef::~IfcDerivedProfileDef(IfcDerivedProfileDef *this)

{
  _func_int *p_Var1;
  char *pcVar2;
  _func_int *p_Var3;
  
  p_Var3 = (this->super_IfcProfileDef).
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcProfileDef).
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                   _vptr_ObjectHelper + (long)p_Var3);
  pcVar2 = (this->Label).ptr.field_2._M_local_buf + (long)p_Var3;
  pcVar2[-0x88] = -0x60;
  pcVar2[-0x87] = -0x5f;
  pcVar2[-0x86] = -0x66;
  pcVar2[-0x85] = '\0';
  pcVar2[-0x84] = '\0';
  pcVar2[-0x83] = '\0';
  pcVar2[-0x82] = '\0';
  pcVar2[-0x81] = '\0';
  pcVar2[0x18] = -0x10;
  pcVar2[0x19] = -0x5f;
  pcVar2[0x1a] = -0x66;
  pcVar2[0x1b] = '\0';
  pcVar2[0x1c] = '\0';
  pcVar2[0x1d] = '\0';
  pcVar2[0x1e] = '\0';
  pcVar2[0x1f] = '\0';
  pcVar2[-0x30] = -0x38;
  pcVar2[-0x2f] = -0x5f;
  pcVar2[-0x2e] = -0x66;
  pcVar2[-0x2d] = '\0';
  pcVar2[-0x2c] = '\0';
  pcVar2[-0x2b] = '\0';
  pcVar2[-0x2a] = '\0';
  pcVar2[-0x29] = '\0';
  if (*(char **)(pcVar2 + -0x10) != pcVar2) {
    operator_delete(*(char **)(pcVar2 + -0x10));
  }
  *(undefined8 *)p_Var1 = 0x9aa218;
  *(undefined8 *)(p_Var1 + 0xa0) = 0x9aa240;
  if (*(code **)(p_Var1 + 0x30) != p_Var1 + 0x40) {
    operator_delete(*(code **)(p_Var1 + 0x30));
  }
  if (*(code **)(p_Var1 + 0x10) != p_Var1 + 0x20) {
    operator_delete(*(code **)(p_Var1 + 0x10));
  }
  operator_delete(p_Var1);
  return;
}

Assistant:

IfcDerivedProfileDef() : Object("IfcDerivedProfileDef") {}